

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

void ncnn::resize_bilinear(Mat *src,Mat *dst,int w,int h,Allocator *allocator,int num_threads)

{
  uint _c;
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  Mat resizem;
  Mat m;
  Mat local_a8;
  Mat local_68;
  
  if ((src->w == w) && (src->h == h)) {
    if (dst != src) {
      piVar1 = src->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = dst->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (dst->allocator == (Allocator *)0x0) {
            if (dst->data != (void *)0x0) {
              free(*(void **)((long)dst->data + -8));
            }
          }
          else {
            (**(code **)(*(long *)dst->allocator + 8))();
          }
        }
      }
      dst->data = (void *)0x0;
      dst->refcount = (int *)0x0;
      dst->elemsize = 0;
      dst->dims = 0;
      dst->w = 0;
      dst->h = 0;
      dst->c = 0;
      dst->cstep = 0;
      piVar1 = src->refcount;
      dst->data = src->data;
      dst->refcount = piVar1;
      dst->elemsize = src->elemsize;
      dst->allocator = src->allocator;
      iVar2 = src->w;
      iVar3 = src->h;
      iVar4 = src->c;
      dst->dims = src->dims;
      dst->w = iVar2;
      dst->h = iVar3;
      dst->c = iVar4;
      dst->cstep = src->cstep;
    }
  }
  else if (src->dims == 3) {
    _c = src->c;
    Mat::create(dst,w,h,_c,src->elemsize,allocator);
    if ((dst->data != (void *)0x0) && (0 < (int)_c && (long)dst->c * dst->cstep != 0)) {
      uVar5 = 0;
      do {
        local_68.elemsize = src->elemsize;
        local_68.data = (void *)(src->cstep * uVar5 * local_68.elemsize + (long)src->data);
        local_68.allocator = src->allocator;
        local_68.refcount = (int *)0x0;
        local_68.w = src->w;
        local_68.dims = 2;
        local_68.c = 1;
        local_68.h = src->h;
        local_68.cstep = (size_t)(src->h * src->w);
        local_a8.elemsize = dst->elemsize;
        local_a8.data = (void *)(dst->cstep * uVar5 * local_a8.elemsize + (long)dst->data);
        local_a8.allocator = dst->allocator;
        local_a8.refcount = (int *)0x0;
        local_a8.w = dst->w;
        local_a8.dims = 2;
        local_a8.c = 1;
        local_a8.h = dst->h;
        local_a8.cstep = (size_t)(dst->h * dst->w);
        resize_bilinear_image(&local_68,&local_a8,w,h);
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + -1;
          UNLOCK();
          if (*local_a8.refcount == 0) {
            if (local_a8.allocator == (Allocator *)0x0) {
              if (local_a8.data != (void *)0x0) {
                free(*(void **)((long)local_a8.data + -8));
              }
            }
            else {
              (**(code **)(*(long *)local_a8.allocator + 8))();
            }
          }
        }
        local_a8.data = (void *)0x0;
        local_a8.refcount = (int *)0x0;
        local_a8.elemsize = 0;
        local_a8.cstep = 0;
        local_a8.dims = 0;
        local_a8.w = 0;
        local_a8.h = 0;
        local_a8.c = 0;
        if (local_68.refcount != (int *)0x0) {
          LOCK();
          *local_68.refcount = *local_68.refcount + -1;
          UNLOCK();
          if (*local_68.refcount == 0) {
            if (local_68.allocator == (Allocator *)0x0) {
              if (local_68.data != (void *)0x0) {
                free(*(void **)((long)local_68.data + -8));
              }
            }
            else {
              (**(code **)(*(long *)local_68.allocator + 8))();
            }
          }
        }
        uVar5 = uVar5 + 1;
      } while (_c != uVar5);
    }
  }
  else if (((src->dims == 2) &&
           (Mat::create(dst,w,h,src->elemsize,allocator), dst->data != (void *)0x0)) &&
          ((long)dst->c * dst->cstep != 0)) {
    resize_bilinear_image(src,dst,w,h);
    return;
  }
  return;
}

Assistant:

void resize_bilinear(const Mat& src, Mat& dst, int w, int h, Allocator* allocator, int num_threads)
{
    if (w == src.w && h == src.h)
    {
        dst = src;
        return;
    }

    size_t elemsize = src.elemsize;

    if (src.dims == 2)
    {
        dst.create(w, h, elemsize, allocator);
        if (dst.empty())
            return;

        resize_bilinear_image(src, dst, w, h);
    }
    else if (src.dims == 3)
    {
        int channels = src.c;

        dst.create(w, h, channels, elemsize, allocator);
        if (dst.empty())
            return;

        // unroll image channel
        #pragma omp parallel for num_threads(num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = src.channel(q);
            Mat resizem = dst.channel(q);

            resize_bilinear_image(m, resizem, w, h);
        }
    }
}